

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asm_writer.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_a4d1::AsmWriteWLADX::writeCommentHelper
          (AsmWriteWLADX *this,int start_pos,int target_column,string *comment)

{
  char cVar1;
  bool bVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uStack_30;
  char c;
  size_t i;
  bool line_start;
  int nw;
  string *comment_local;
  int target_column_local;
  int start_pos_local;
  AsmWriteWLADX *this_local;
  
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    bVar2 = true;
    uStack_30 = 0;
    i._4_4_ = start_pos;
    while( true ) {
      uVar3 = std::__cxx11::string::length();
      if (uVar3 <= uStack_30) break;
      if (bVar2) {
        i._4_4_ = indent_column(this,this->m_outFile,target_column,i._4_4_,true);
        bVar2 = false;
      }
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)comment);
      cVar1 = *pcVar4;
      fputc((int)cVar1,(FILE *)this->m_outFile);
      if (cVar1 == '\n') {
        bVar2 = true;
        i._4_4_ = 0;
      }
      uStack_30 = uStack_30 + 1;
    }
    fputc(10,(FILE *)this->m_outFile);
  }
  else {
    fputc(10,(FILE *)this->m_outFile);
  }
  return;
}

Assistant:

void writeCommentHelper(const int start_pos, const int target_column, const std::string &comment) {

		if (comment.empty()) {
			fputc('\n', m_outFile);
			return;
		}

		int nw = start_pos;

		bool line_start = true;
		for (size_t i=0; i<comment.length(); ++i) {
			if (line_start) {
				nw = indent_column(m_outFile, target_column, nw, true);
				line_start = false;
			}
			char c = comment[i];
			fputc(c, m_outFile);
			if (c == '\n') {
				line_start = true;
				nw = 0;
			}
		}
		fputc('\n', m_outFile);
	}